

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv4Transmitter::DeleteTransmissionInfo
          (RTPUDPv4Transmitter *this,RTPTransmissionInfo *i)

{
  if (this->init == true) {
    RTPDelete<jrtplib::RTPTransmissionInfo>
              (i,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    return;
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!init)
		return;

	RTPDelete(i, GetMemoryManager());
}